

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::RealMath1Function<&atan>::~RealMath1Function(RealMath1Function<&atan> *this)

{
  RealMath1Function<&atan> *this_local;
  
  ~RealMath1Function(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

RealMath1Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getRealType()},
                               comp.getRealType(), false) {}